

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerResults.cpp
# Opt level: O3

void __thiscall
AsyncRgbLedAnalyzerResults::GenerateExportFile
          (AsyncRgbLedAnalyzerResults *this,char *file,DisplayBase display_base,
          U32 export_type_user_id)

{
  U8 bitSize;
  char cVar1;
  ulonglong uVar2;
  undefined8 uVar3;
  size_t sVar4;
  ostream *poVar5;
  ulonglong uVar6;
  U8 webColor [3];
  RGBValue rgb;
  char webBuf [8];
  Frame frame;
  char gs [16];
  char rs [16];
  char bs [16];
  ofstream file_stream;
  char time_str [128];
  byte local_343;
  byte local_342;
  byte local_341;
  DisplayBase local_340;
  uint local_33c;
  ulonglong local_338;
  RGBValue local_330;
  ulonglong local_328;
  undefined8 local_320;
  char local_318 [8];
  ulonglong local_310 [2];
  U64 local_300;
  char local_2e8 [16];
  char local_2d8 [16];
  char local_2c8 [16];
  long local_2b8;
  filebuf local_2b0 [240];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_340 = display_base;
  std::ofstream::ofstream(&local_2b8,file,_S_out);
  local_328 = Analyzer::GetTriggerSample();
  local_33c = Analyzer::GetSampleRate();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"Time [s], Packet ID, LED Index, Red, Green, Blue, Web-CSS",0x39)
  ;
  std::ios::widen((char)(ostream *)&local_2b8 + (char)*(undefined8 *)(local_2b8 + -0x18));
  std::ostream::put((char)&local_2b8);
  std::ostream::flush();
  uVar2 = AnalyzerResults::GetNumFrames();
  if (uVar2 != 0) {
    uVar6 = 0;
    do {
      AnalyzerResults::GetFrame((ulonglong)local_310);
      uVar3 = AnalyzerResults::GetPacketContainingFrameSequential((ulonglong)this);
      AnalyzerHelpers::GetTimeString(local_310[0],local_328,local_33c,local_b8,0x80);
      local_338 = uVar6;
      local_320 = uVar3;
      local_330 = RGBValue::CreateFromU64(local_300);
      GenerateRGBStrings(this,&local_330,local_340,0x10,local_2d8,local_2e8,local_2c8);
      bitSize = AsyncRgbLedAnalyzerSettings::BitSize(this->mSettings);
      RGBValue::ConvertTo8Bit(&local_330,bitSize,&local_343);
      snprintf(local_318,8,"#%02x%02x%02x",(ulong)local_343,(ulong)local_342,(ulong)local_341);
      sVar4 = strlen(local_b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,local_b8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,",",1);
      poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      sVar4 = strlen(local_2d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_2d8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      sVar4 = strlen(local_2e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_2e8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      sVar4 = strlen(local_2c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_2c8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      sVar4 = strlen(local_318);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_318,sVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      cVar1 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,local_338);
      if (cVar1 != '\0') {
        std::ofstream::close();
        Frame::~Frame((Frame *)local_310);
        goto LAB_00107dcd;
      }
      Frame::~Frame((Frame *)local_310);
      uVar6 = local_338 + 1;
    } while (uVar2 != uVar6);
  }
  std::ofstream::close();
LAB_00107dcd:
  local_2b8 = _VTT;
  *(undefined8 *)(local_2b0 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_2b0);
  std::ios_base::~ios_base(local_1c0);
  return;
}

Assistant:

void AsyncRgbLedAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    file_stream << "Time [s], Packet ID, LED Index, Red, Green, Blue, Web-CSS" << std::endl;

    const U64 num_frames = GetNumFrames();

    for( U64 i = 0; i < num_frames; i++ )
    {
        const Frame frame = GetFrame( i );
        U64 packetId = GetPacketContainingFrameSequential( num_frames );

        if( packetId == INVALID_RESULT_INDEX )
        {
            packetId = -1;
        }

        char time_str[ 128 ];
        AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

        RGBValue rgb = RGBValue::CreateFromU64( frame.mData1 );

        // RGB numerical value representation
        const size_t bufSize = 16;
        char rs[ bufSize ], gs[ bufSize ], bs[ bufSize ];
        GenerateRGBStrings( rgb, display_base, bufSize, rs, gs, bs );

        // CSS representation
        U8 webColor[ 3 ];
        rgb.ConvertTo8Bit( mSettings->BitSize(), webColor );
        char webBuf[ 8 ];
        ::snprintf( webBuf, sizeof( webBuf ), "#%02x%02x%02x", webColor[ 0 ], webColor[ 1 ], webColor[ 2 ] );

        file_stream << time_str << "," << packetId << "," << frame.mData2 << "," << rs << "," << gs << "," << bs << "," << webBuf
                    << std::endl;

        if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
        {
            file_stream.close();
            return;
        }
    }

    file_stream.close();
}